

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void * nk_memcopy(void *dst0,void *src0,nk_size length)

{
  ulong uVar1;
  char *pcVar2;
  undefined4 *puVar3;
  char *pcVar4;
  char *local_38;
  char *src;
  char *dst;
  nk_ptr t;
  nk_size length_local;
  void *src0_local;
  void *dst0_local;
  
  if ((length != 0) && (dst0 != src0)) {
    dst = (char *)length;
    t = length;
    if (dst0 < src0) {
      local_38 = (char *)src0;
      src = (char *)dst0;
      if ((((ulong)src0 | (ulong)dst0) & 3) != 0) {
        if (((((ulong)src0 ^ (ulong)dst0) & 3) == 0) && (3 < length)) {
          dst = (char *)(4 - ((ulong)src0 & 3));
        }
        t = length - (long)dst;
        local_38 = (char *)src0;
        src = (char *)dst0;
        do {
          pcVar2 = local_38 + 1;
          pcVar4 = src + 1;
          *src = *local_38;
          dst = dst + -1;
          local_38 = pcVar2;
          src = pcVar4;
        } while (dst != (char *)0x0);
      }
      for (uVar1 = t >> 2; uVar1 != 0; uVar1 = uVar1 - 1) {
        *(undefined4 *)src = *(undefined4 *)local_38;
        local_38 = local_38 + 4;
        src = src + 4;
      }
      for (uVar1 = t & 3; uVar1 != 0; uVar1 = uVar1 - 1) {
        *src = *local_38;
        local_38 = local_38 + 1;
        src = src + 1;
      }
    }
    else {
      local_38 = (char *)(length + (long)src0);
      src = (char *)(length + (long)dst0);
      if ((((ulong)local_38 | (ulong)src) & 3) != 0) {
        if (((((ulong)local_38 ^ (ulong)src) & 3) == 0) && (4 < length)) {
          dst = (char *)((ulong)local_38 & 3);
        }
        t = length - (long)dst;
        do {
          puVar3 = (undefined4 *)((long)local_38 + -1);
          pcVar2 = src + -1;
          src[-1] = *(char *)((long)local_38 + -1);
          dst = dst + -1;
          local_38 = (char *)puVar3;
          src = pcVar2;
        } while (dst != (char *)0x0);
      }
      for (uVar1 = t >> 2; uVar1 != 0; uVar1 = uVar1 - 1) {
        local_38 = (char *)((long)local_38 + -4);
        src = src + -4;
        *(undefined4 *)src = *(undefined4 *)local_38;
      }
      for (uVar1 = t & 3; uVar1 != 0; uVar1 = uVar1 - 1) {
        src[-1] = *(char *)((long)local_38 + -1);
        local_38 = (char *)((long)local_38 + -1);
        src = src + -1;
      }
    }
  }
  return dst0;
}

Assistant:

NK_INTERN void*
nk_memcopy(void *dst0, const void *src0, nk_size length)
{
    nk_ptr t;
    char *dst = (char*)dst0;
    const char *src = (const char*)src0;
    if (length == 0 || dst == src)
        goto done;

    #define nk_word int
    #define nk_wsize sizeof(nk_word)
    #define nk_wmask (nk_wsize-1)
    #define NK_TLOOP(s) if (t) NK_TLOOP1(s)
    #define NK_TLOOP1(s) do { s; } while (--t)

    if (dst < src) {
        t = (nk_ptr)src; /* only need low bits */
        if ((t | (nk_ptr)dst) & nk_wmask) {
            if ((t ^ (nk_ptr)dst) & nk_wmask || length < nk_wsize)
                t = length;
            else
                t = nk_wsize - (t & nk_wmask);
            length -= t;
            NK_TLOOP1(*dst++ = *src++);
        }
        t = length / nk_wsize;
        NK_TLOOP(*(nk_word*)(void*)dst = *(const nk_word*)(const void*)src;
            src += nk_wsize; dst += nk_wsize);
        t = length & nk_wmask;
        NK_TLOOP(*dst++ = *src++);
    } else {
        src += length;
        dst += length;
        t = (nk_ptr)src;
        if ((t | (nk_ptr)dst) & nk_wmask) {
            if ((t ^ (nk_ptr)dst) & nk_wmask || length <= nk_wsize)
                t = length;
            else
                t &= nk_wmask;
            length -= t;
            NK_TLOOP1(*--dst = *--src);
        }
        t = length / nk_wsize;
        NK_TLOOP(src -= nk_wsize; dst -= nk_wsize;
            *(nk_word*)(void*)dst = *(const nk_word*)(const void*)src);
        t = length & nk_wmask;
        NK_TLOOP(*--dst = *--src);
    }
    #undef nk_word
    #undef nk_wsize
    #undef nk_wmask
    #undef NK_TLOOP
    #undef NK_TLOOP1
done:
    return (dst0);
}